

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = cParams->windowLog;
  params->windowLog = uVar2;
  if (params->bucketSizeLog == 0) {
    params->bucketSizeLog = 3;
  }
  if (params->minMatchLength == 0) {
    params->minMatchLength = 0x40;
  }
  if (params->hashLog == 0) {
    uVar3 = uVar2 - 7;
    uVar4 = 6;
    if (6 < uVar3) {
      uVar4 = uVar3;
    }
    params->hashLog = uVar4;
    if (0x1e < uVar3) {
      __assert_fail("params->hashLog <= ZSTD_HASHLOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7cdf,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
  }
  if (params->hashRateLog == 0) {
    UVar1 = uVar2 - params->hashLog;
    if (uVar2 < params->hashLog) {
      UVar1 = 0;
    }
    params->hashRateLog = UVar1;
  }
  uVar2 = params->hashLog;
  if (params->bucketSizeLog < params->hashLog) {
    uVar2 = params->bucketSizeLog;
  }
  params->bucketSizeLog = uVar2;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}